

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O1

int run_test_fs_copyfile(void)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int iVar3;
  uint file;
  int extraout_EAX;
  int extraout_EAX_00;
  char *loop;
  ulong uVar4;
  uv_loop_t *req_00;
  uv_loop_t *path;
  uv_fs_t *req_01;
  char *unaff_R12;
  uv_fs_t *req_02;
  char *unaff_R15;
  code *req_03;
  int64_t eval_b;
  int64_t eval_a;
  char src [14];
  uv_fs_t req;
  uv_fs_t uStackY_5d8;
  ulong uStackY_420;
  uv_buf_t *puStackY_418;
  uv_fs_t *puStackY_410;
  uv_fs_t *puStackY_408;
  uv_buf_t uStack_3f0;
  uv_fs_t uStack_3e0;
  uv_loop_t *puStack_228;
  uv_buf_t *puStack_220;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [16];
  char *local_180;
  undefined8 local_130;
  
  req_00 = (uv_loop_t *)local_1f8;
  local_1e8._8_6_ = 0x6372735f65;
  local_1e8._0_6_ = 0x665f74736574;
  local_1e8._6_2_ = 0x6c69;
  loop = (char *)uv_default_loop();
  iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,local_1e8,
                         "test_file_dst",-1,(uv_fs_cb)0x0);
  if (iVar3 == -0x16) {
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe28);
    unaff_R15 = local_1e8;
    unlink(unaff_R15);
    unaff_R12 = "test_file_dst";
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,unaff_R15,
                           "test_file_dst",0,(uv_fs_cb)0x0);
    if (local_180 != (char *)0xfffffffffffffffe) goto LAB_00156584;
    if (iVar3 != -2) goto LAB_00156589;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe28);
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,"test_file_dst",
                       (uv_fs_cb)0x0);
    if (iVar3 == 0) goto LAB_0015658e;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe28);
    unaff_R15 = local_1e8;
    touch_file(unaff_R15,0xc);
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,unaff_R15,unaff_R15,
                           0,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00156593;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe28);
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,local_1e8,(uv_fs_cb)0x0)
    ;
    local_1f0 = (undefined1  [8])(long)iVar3;
    local_1f8 = (undefined1  [8])0x0;
    if (local_1f0 != (undefined1  [8])0x0) goto LAB_00156598;
    local_1f0 = (undefined1  [8])local_130;
    local_1f8 = (undefined1  [8])0xc;
    if ((__pthread_internal_list *)local_130 != (__pthread_internal_list *)0xc) goto LAB_001565a5;
    req_00 = (uv_loop_t *)&stack0xfffffffffffffe28;
    uv_fs_req_cleanup((uv_fs_t *)req_00);
    unlink(local_1e8);
    unaff_R15 = "test_file_dst";
    unlink("test_file_dst");
    path = (uv_loop_t *)0x0;
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)req_00,"test/fixtures/load_error.node",
                           "test_file_dst",0,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001565b2;
    req_00 = (uv_loop_t *)&stack0xfffffffffffffe28;
    handle_result((uv_fs_t *)req_00);
    unaff_R15 = "test_file_dst";
    unlink("test_file_dst");
    unaff_R12 = local_1e8;
    touch_file(unaff_R12,0);
    path = (uv_loop_t *)0x0;
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)req_00,unaff_R12,"test_file_dst",0,
                           (uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001565b7;
    req_00 = (uv_loop_t *)&stack0xfffffffffffffe28;
    handle_result((uv_fs_t *)req_00);
    path = (uv_loop_t *)0x0;
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)req_00,"test/fixtures/load_error.node",
                           "test_file_dst",0,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001565bc;
    req_00 = (uv_loop_t *)&stack0xfffffffffffffe28;
    handle_result((uv_fs_t *)req_00);
    path = (uv_loop_t *)0x0;
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)req_00,"test/fixtures/load_error.node",
                           "test_file_dst",1,(uv_fs_cb)0x0);
    req_03 = (code *)unaff_R15;
    if (iVar3 != -0x11) goto LAB_001565c1;
    req_00 = (uv_loop_t *)&stack0xfffffffffffffe28;
    uv_fs_req_cleanup((uv_fs_t *)req_00);
    req_03 = (code *)local_1e8;
    touch_file((char *)req_03,1);
    path = (uv_loop_t *)0x0;
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)req_00,(char *)req_03,"test_file_dst",0,
                           (uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001565c6;
    req_00 = (uv_loop_t *)&stack0xfffffffffffffe28;
    handle_result((uv_fs_t *)req_00);
    unlink("test_file_dst");
    unaff_R12 = local_1e8;
    touch_file(unaff_R12,0x2000);
    path = (uv_loop_t *)0x0;
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)req_00,unaff_R12,"test_file_dst",0,
                           (uv_fs_cb)0x0);
    req_03 = (code *)"test_file_dst";
    if (iVar3 != 0) goto LAB_001565cb;
    req_00 = (uv_loop_t *)&stack0xfffffffffffffe28;
    handle_result((uv_fs_t *)req_00);
    req_03 = handle_result;
    unlink(local_1e8);
    unaff_R12 = "test_file_dst";
    unlink("test_file_dst");
    path = (uv_loop_t *)loop;
    iVar3 = uv_fs_copyfile((uv_loop_t *)loop,(uv_fs_t *)req_00,"test/fixtures/load_error.node",
                           "test_file_dst",0,handle_result);
    if (iVar3 != 0) goto LAB_001565d0;
    if (result_check_count != 5) goto LAB_001565d5;
    req_00 = (uv_loop_t *)0x0;
    path = (uv_loop_t *)loop;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (result_check_count != 6) goto LAB_001565da;
    unlink("test_file_dst");
    req_00 = (uv_loop_t *)&stack0xfffffffffffffe28;
    path = (uv_loop_t *)loop;
    iVar3 = uv_fs_copyfile((uv_loop_t *)loop,(uv_fs_t *)req_00,"test/fixtures/load_error.node",
                           "test_file_dst",-1,fail_cb);
    if (iVar3 != -0x16) goto LAB_001565df;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    loop = "test_file_dst";
    unlink("test_file_dst");
    req_00 = (uv_loop_t *)&stack0xfffffffffffffe28;
    path = (uv_loop_t *)0x0;
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)req_00,"test/fixtures/load_error.node",
                           "test_file_dst",2,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001565e4;
    loop = &stack0xfffffffffffffe28;
    handle_result((uv_fs_t *)loop);
    unlink("test_file_dst");
    path = (uv_loop_t *)0x0;
    req_00 = (uv_loop_t *)loop;
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)loop,"test/fixtures/load_error.node",
                           "test_file_dst",4,(uv_fs_cb)0x0);
    if (0 < iVar3) goto LAB_001565e9;
    if (iVar3 == 0) {
      handle_result((uv_fs_t *)&stack0xfffffffffffffe28);
    }
    loop = "test_file_dst";
    unlink("test_file_dst");
    touch_file("test_file_dst",0);
    chmod("test_file_dst",0x124);
    req_00 = (uv_loop_t *)&stack0xfffffffffffffe28;
    path = (uv_loop_t *)0x0;
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)req_00,"test/fixtures/load_error.node",
                           "test_file_dst",0,(uv_fs_cb)0x0);
    if (local_180 != (char *)0xfffffffffffffff3) goto LAB_001565ee;
    if (iVar3 == -0xd) {
      uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe28);
      unlink("test_file_dst");
      return 0;
    }
  }
  else {
    run_test_fs_copyfile_cold_1();
LAB_00156584:
    run_test_fs_copyfile_cold_2();
LAB_00156589:
    run_test_fs_copyfile_cold_3();
LAB_0015658e:
    run_test_fs_copyfile_cold_21();
LAB_00156593:
    run_test_fs_copyfile_cold_4();
LAB_00156598:
    run_test_fs_copyfile_cold_5();
LAB_001565a5:
    path = (uv_loop_t *)local_1f0;
    run_test_fs_copyfile_cold_6();
LAB_001565b2:
    run_test_fs_copyfile_cold_7();
LAB_001565b7:
    run_test_fs_copyfile_cold_8();
LAB_001565bc:
    run_test_fs_copyfile_cold_9();
    req_03 = (code *)unaff_R15;
LAB_001565c1:
    run_test_fs_copyfile_cold_10();
LAB_001565c6:
    run_test_fs_copyfile_cold_11();
LAB_001565cb:
    run_test_fs_copyfile_cold_12();
LAB_001565d0:
    run_test_fs_copyfile_cold_13();
LAB_001565d5:
    run_test_fs_copyfile_cold_14();
LAB_001565da:
    run_test_fs_copyfile_cold_15();
LAB_001565df:
    run_test_fs_copyfile_cold_16();
LAB_001565e4:
    run_test_fs_copyfile_cold_17();
LAB_001565e9:
    run_test_fs_copyfile_cold_18();
LAB_001565ee:
    run_test_fs_copyfile_cold_19();
  }
  run_test_fs_copyfile_cold_20();
  req_02 = &uStack_3e0;
  puStackY_408 = (uv_fs_t *)0x15662b;
  puStack_228 = (uv_loop_t *)loop;
  puStack_220 = (uv_buf_t *)unaff_R12;
  file = uv_fs_open((uv_loop_t *)0x0,req_02,(char *)path,0x241,0x180,(uv_fs_cb)0x0);
  puStackY_408 = (uv_fs_t *)0x156635;
  req_01 = req_02;
  uv_fs_req_cleanup(req_02);
  if ((int)file < 0) {
LAB_001566da:
    puStackY_408 = (uv_fs_t *)0x1566df;
    touch_file_cold_1();
  }
  else {
    puStackY_408 = (uv_fs_t *)0x15664e;
    uStack_3f0 = uv_buf_init("a",1);
    if ((int)req_00 != 0) {
      req_02 = (uv_fs_t *)0x0;
      req_03 = (code *)&uStack_3e0;
      unaff_R12 = (char *)&uStack_3f0;
      do {
        puStackY_408 = (uv_fs_t *)0x15668c;
        iVar3 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)req_03,file,(uv_buf_t *)unaff_R12,1,
                            (int64_t)req_02,(uv_fs_cb)0x0);
        puStackY_408 = (uv_fs_t *)0x156696;
        req_01 = (uv_fs_t *)req_03;
        uv_fs_req_cleanup((uv_fs_t *)req_03);
        if (iVar3 < 0) {
          puStackY_408 = (uv_fs_t *)0x1566da;
          touch_file_cold_2();
          goto LAB_001566da;
        }
        req_02 = (uv_fs_t *)((long)&req_02->data + 1);
      } while ((uv_fs_t *)((ulong)req_00 & 0xffffffff) != req_02);
    }
    req_02 = &uStack_3e0;
    puStackY_408 = (uv_fs_t *)0x1566b5;
    file = uv_fs_close((uv_loop_t *)0x0,req_02,file,(uv_fs_cb)0x0);
    puStackY_408 = (uv_fs_t *)0x1566bf;
    req_01 = req_02;
    uv_fs_req_cleanup(req_02);
    if (file == 0) {
      return extraout_EAX;
    }
  }
  uVar4 = (ulong)file;
  puStackY_408 = (uv_fs_t *)handle_result;
  touch_file_cold_3();
  uStackY_420 = uVar4;
  puStackY_418 = (uv_buf_t *)unaff_R12;
  puStackY_410 = req_02;
  puStackY_408 = (uv_fs_t *)req_03;
  if (req_01->fs_type == UV_FS_COPYFILE) {
    if (req_01->result != 0) goto LAB_00156782;
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&uStackY_5d8,req_01->path,(uv_fs_cb)0x0);
    uVar2 = uStackY_5d8.statbuf.st_size;
    uVar1 = uStackY_5d8.statbuf.st_mode;
    if (iVar3 != 0) goto LAB_00156787;
    uv_fs_req_cleanup(&uStackY_5d8);
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&uStackY_5d8,"test_file_dst",(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015678c;
    if (uStackY_5d8.statbuf.st_size == uVar2) {
      if (uStackY_5d8.statbuf.st_mode == uVar1) {
        uv_fs_req_cleanup(&uStackY_5d8);
        uv_fs_req_cleanup(req_01);
        result_check_count = result_check_count + 1;
        return extraout_EAX_00;
      }
      goto LAB_00156796;
    }
  }
  else {
    handle_result_cold_1();
LAB_00156782:
    handle_result_cold_2();
LAB_00156787:
    handle_result_cold_3();
LAB_0015678c:
    handle_result_cold_4();
  }
  handle_result_cold_5();
LAB_00156796:
  handle_result_cold_6();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-copyfile.c"
          ,0x2a,"fail_cb should not have been called");
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(fs_copyfile) {
#if defined(__ASAN__)
  RETURN_SKIP("Test does not currently work in ASAN");
#endif
  const char src[] = "test_file_src";
  uv_loop_t* loop;
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Fails with EINVAL if bad flags are passed. */
  r = uv_fs_copyfile(NULL, &req, src, dst, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&req);

  /* Fails with ENOENT if source does not exist. */
  unlink(src);
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(req.result == UV_ENOENT);
  ASSERT(r == UV_ENOENT);
  uv_fs_req_cleanup(&req);
  /* The destination should not exist. */
  r = uv_fs_stat(NULL, &req, dst, NULL);
  ASSERT(r != 0);
  uv_fs_req_cleanup(&req);

  /* Succeeds if src and dst files are identical. */
  touch_file(src, 12);
  r = uv_fs_copyfile(NULL, &req, src, src, 0, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);
  /* Verify that the src file did not get truncated. */
  r = uv_fs_stat(NULL, &req, src, NULL);
  ASSERT_EQ(r, 0);
  ASSERT_EQ(req.statbuf.st_size, 12);
  uv_fs_req_cleanup(&req);
  unlink(src);

  /* Copies file synchronously. Creates new file. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies a file of size zero. */
  unlink(dst);
  touch_file(src, 0);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies file synchronously. Overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Fails to overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_EXCL, NULL);
  ASSERT(r == UV_EEXIST);
  uv_fs_req_cleanup(&req);

  /* Truncates when an existing destination is larger than the source file. */
  touch_file(src, 1);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies a larger file. */
  unlink(dst);
  touch_file(src, 4096 * 2);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);
  unlink(src);

  /* Copies file asynchronously */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, 0, handle_result);
  ASSERT(r == 0);
  ASSERT(result_check_count == 5);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(result_check_count == 6);

  /* If the flags are invalid, the loop should not be kept open */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);

  /* Copies file using UV_FS_COPYFILE_FICLONE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies file using UV_FS_COPYFILE_FICLONE_FORCE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE_FORCE,
                     NULL);
  ASSERT(r <= 0);

  if (r == 0)
    handle_result(&req);

#ifndef _WIN32
  /* Copying respects permissions/mode. */
  unlink(dst);
  touch_file(dst, 0);
  chmod(dst, S_IRUSR|S_IRGRP|S_IROTH); /* Sets file mode to 444 (read-only). */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  /* On IBMi PASE, qsecofr users can overwrite read-only files */
# ifndef __PASE__
  ASSERT(req.result == UV_EACCES);
  ASSERT(r == UV_EACCES);
# endif
  uv_fs_req_cleanup(&req);
#endif

  unlink(dst); /* Cleanup */
  return 0;
}